

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O1

UnitBoundedPolynomial<5U,_1U> *
UnitBoundedPolynomial<5U,_1U>::fit
          (UnitBoundedPolynomial<5U,_1U> *__return_storage_ptr__,Matrix<double,_1,_3,_1,_1,_3> *A,
          Matrix<double,_1,_3,_1,_1,_3> *B)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar3 = (A->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [0];
  dVar4 = (A->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [1];
  dVar1 = (A->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [2];
  dVar5 = (B->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [0];
  dVar6 = (B->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [1];
  dVar2 = (B->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [2];
  __return_storage_ptr__->_dims[0].coeffs[0] = dVar3;
  __return_storage_ptr__->_dims[0].coeffs[1] = dVar4;
  __return_storage_ptr__->_dims[0].coeffs[2] = dVar1 * 0.5;
  __return_storage_ptr__->_dims[0].coeffs[3] =
       dVar2 * 0.5 + dVar6 * -4.0 + dVar5 * 10.0 + dVar1 * -1.5 + dVar3 * -10.0 + dVar4 * -6.0;
  __return_storage_ptr__->_dims[0].coeffs[4] =
       dVar2 * -1.0 + dVar6 * 7.0 + dVar5 * -15.0 + dVar1 * 1.5 + dVar3 * 15.0 + dVar4 * 8.0;
  __return_storage_ptr__->_dims[0].coeffs[5] =
       dVar2 * 0.5 + dVar6 * -3.0 + dVar5 * 6.0 + dVar1 * -0.5 + dVar3 * -6.0 + dVar4 * -3.0;
  calculateLength(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

UnitBoundedPolynomial<Order, Dims> UnitBoundedPolynomial<Order, Dims>::fit(Matrix<double, Dims, Poly1::RequiredValues> A, 
                                                                           Matrix<double, Dims, Poly1::RequiredValues> B)
{
    UnitBoundedPolynomial<Order, Dims> out;

    for (int k = 0; k < Dims; ++k)
    {
        out._dims[k] = Poly1::fit(A.row(k).transpose(), B.row(k).transpose());
    }

    out.calculateLength();

    return out;
}